

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::RegularLink<diy::Bounds<float>_>::RegularLink(RegularLink<diy::Bounds<float>_> *this)

{
  undefined8 *in_RDI;
  Registrar<diy::RegularLink<diy::Bounds<float>_>_> *in_stack_ffffffffffffffd0;
  Bounds<float> *this_00;
  
  Factory<diy::Link>::Registrar<diy::RegularLink<diy::Bounds<float>_>_>::Registrar
            (in_stack_ffffffffffffffd0);
  *in_RDI = &PTR_id_abi_cxx11__002f0c90;
  *(undefined4 *)(in_RDI + 4) = 0;
  Catch::clara::std::
  map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
  ::map((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
         *)0x1f5e0b);
  Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x1f5e1e);
  this_00 = (Bounds<float> *)(in_RDI + 0xe);
  Bounds<float>::Bounds(this_00,(int)((ulong)in_RDI >> 0x20));
  Bounds<float>::Bounds(this_00,(int)((ulong)in_RDI >> 0x20));
  Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::vector
            ((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)0x1f5e5b);
  Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::vector
            ((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)0x1f5e6c);
  Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x1f5e7d);
  return;
}

Assistant:

RegularLink():
                  dim_(0), core_(0), bounds_(0)               {}